

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_3650dd::HandleWriteImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool append,cmExecutionStatus *status)

{
  bool bVar1;
  byte bVar2;
  reference pbVar3;
  cmMakefile *pcVar4;
  string *a;
  char *pcVar5;
  _Ios_Openmode _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined1 local_408 [8];
  string error_1;
  string local_3d8 [32];
  string_view local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a0;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_398;
  undefined1 local_388 [8];
  string message;
  undefined1 local_348 [8];
  string error;
  ofstream file;
  Status SStack_118;
  mode_t newMode;
  byte local_10d;
  mode_t local_10c;
  bool writable;
  Status SStack_108;
  mode_t mode;
  undefined1 local_100 [8];
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string e;
  char local_89;
  string local_88;
  undefined1 local_58 [8];
  string fileName;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator i;
  cmExecutionStatus *status_local;
  bool append_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)status;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  fileName.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++(&local_30,0);
  pbVar3 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_30);
  std::__cxx11::string::string((string *)local_58,(string *)pbVar3);
  pbVar3 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_30);
  bVar1 = cmsys::SystemTools::FileIsFullPath(pbVar3);
  if (!bVar1) {
    pcVar4 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)i._M_current);
    a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar4);
    local_89 = '/';
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              (&local_88,a,&local_89,pbVar3);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  e.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++(&local_30,0);
  pcVar4 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)i._M_current);
  bVar1 = cmMakefile::CanIWriteThisFile(pcVar4,(string *)local_58);
  if (bVar1) {
    cmsys::SystemTools::GetFilenamePath((string *)local_100,(string *)local_58);
    SStack_108 = cmsys::SystemTools::MakeDirectory((string *)local_100,(mode_t *)0x0);
    local_10c = 0;
    local_10d = 0;
    SStack_118 = cmsys::SystemTools::GetPermissions((string *)local_58,&local_10c);
    bVar1 = cmsys::Status::operator_cast_to_bool(&stack0xfffffffffffffee8);
    if (bVar1) {
      local_10d = (local_10c & 0x80) != 0;
      if (!(bool)local_10d) {
        cmsys::SystemTools::SetPermissions((string *)local_58,local_10c | 0x90,false);
      }
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _Var6 = _S_out;
    if (append) {
      _Var6 = _S_app;
    }
    std::ofstream::ofstream((void *)((long)&error.field_2 + 8),pcVar5,_Var6);
    bVar2 = std::ios::operator!((ios *)((long)&error.field_2 +
                                       *(long *)(error.field_2._8_8_ + -0x18) + 8));
    if ((bVar2 & 1) == 0) {
      local_3a0._M_current = local_30._M_current;
      local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(args);
      local_398 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_3a0,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_3a8);
      std::__cxx11::string::string(local_3d8);
      local_3b8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_3d8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)((long)&error_1.field_2 + 8));
      cmJoin((string *)local_388,&local_398,local_3b8,stack0xfffffffffffffc18);
      std::__cxx11::string::~string(local_3d8);
      std::operator<<((ostream *)((long)&error.field_2 + 8),(string *)local_388);
      bVar2 = std::ios::operator!((ios *)((long)&error.field_2 +
                                         *(long *)(error.field_2._8_8_ + -0x18) + 8));
      if ((bVar2 & 1) == 0) {
        std::ofstream::close();
        if ((local_10c != 0) && ((local_10d & 1) == 0)) {
          cmsys::SystemTools::SetPermissions((string *)local_58,local_10c,false);
        }
        args_local._7_1_ = true;
        dir.field_2._12_4_ = 1;
      }
      else {
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        cmStrCat<char_const(&)[15],std::__cxx11::string,char_const(&)[6],std::__cxx11::string&>
                  ((string *)local_408,(char (*) [15])"write failed (",&local_428,
                   (char (*) [6])"):\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        std::__cxx11::string::~string((string *)&local_428);
        cmExecutionStatus::SetError((cmExecutionStatus *)i._M_current,(string *)local_408);
        args_local._7_1_ = false;
        dir.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_408);
      }
      std::__cxx11::string::~string((string *)local_388);
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      cmStrCat<char_const(&)[29],std::__cxx11::string,char_const(&)[6],std::__cxx11::string&>
                ((string *)local_348,(char (*) [29])"failed to open for writing (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&message.field_2 + 8),(char (*) [6])"):\n  ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
      cmExecutionStatus::SetError((cmExecutionStatus *)i._M_current,(string *)local_348);
      args_local._7_1_ = false;
      dir.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_348);
    }
    std::ofstream::~ofstream((void *)((long)&error.field_2 + 8));
    std::__cxx11::string::~string((string *)local_100);
  }
  else {
    std::operator+(&local_d8,"attempted to write a file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   &local_d8," into a source directory.");
    std::__cxx11::string::~string((string *)&local_d8);
    cmExecutionStatus::SetError((cmExecutionStatus *)i._M_current,(string *)local_b8);
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = false;
    dir.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_b8);
  }
  std::__cxx11::string::~string((string *)local_58);
  return args_local._7_1_;
}

Assistant:

bool HandleWriteImpl(std::vector<std::string> const& args, bool append,
                     cmExecutionStatus& status)
{
  auto i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', *i);
  }

  i++;

  if (!status.GetMakefile().CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error =
      cmStrCat("failed to open for writing (",
               cmSystemTools::GetLastSystemError(), "):\n  ", fileName);
    status.SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error =
      cmStrCat("write failed (", cmSystemTools::GetLastSystemError(), "):\n  ",
               fileName);
    status.SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}